

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t
exr_attr_chlist_add_with_length
          (exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,int32_t namelen,
          exr_pixel_type_t ptype,exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  long lVar1;
  int iVar2;
  exr_result_t eVar3;
  undefined8 *puVar4;
  int in_ECX;
  undefined8 *puVar5;
  char *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int i_1;
  int i;
  int nsz;
  int ord;
  int32_t c;
  exr_result_t rv;
  int32_t maxlen;
  int insertpos;
  int newcount;
  exr_attr_chlist_entry_t *olist;
  exr_attr_chlist_entry_t *nlist;
  exr_attr_chlist_entry_t nent;
  exr_attr_string_t *in_stack_ffffffffffffff60;
  exr_context_t in_stack_ffffffffffffff68;
  exr_attr_string_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar6;
  int local_80;
  int local_7c;
  int local_74;
  int local_68;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_40;
  undefined4 uStack_3c;
  int local_38;
  int iStack_34;
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_50,0,0x20);
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid channel list pointer to chlist_add_with_length");
  }
  else if (((local_20 == (char *)0x0) || (*local_20 == '\0')) || (local_24 == 0)) {
    if (local_20 == (char *)0x0) {
      local_20 = "<NULL>";
    }
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,"Channel name must not be empty, received \'%s\'",local_20);
  }
  else if ((int)(uint)*(byte *)(local_10 + 2) < local_24) {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,0xc,
                         "Channel name must shorter than length allowed by file (%d), received \'%s\' (%d)"
                         ,(uint)*(byte *)(local_10 + 2),local_20,local_24);
  }
  else if (((local_28 == 0) || (local_28 == 1)) || (local_28 == 2)) {
    if ((local_2c == 0) || (local_2c == 1)) {
      if ((in_stack_00000008 < 1) || (in_stack_00000010 < 1)) {
        local_4 = (**(code **)(local_10 + 0x48))
                            (local_10,3,
                             "Invalid pixel sampling (x %d y %d) adding channel \'%s\' to list",
                             in_stack_00000008,in_stack_00000010,local_20);
      }
      else {
        local_68 = 0;
        lVar1 = *(long *)(local_18 + 2);
        for (local_74 = 0; local_74 < *local_18; local_74 = local_74 + 1) {
          iVar2 = strcmp(local_20,*(char **)(lVar1 + (long)local_74 * 0x20 + 8));
          if (iVar2 < 0) {
            local_68 = local_74;
            break;
          }
          if (iVar2 == 0) {
            eVar3 = (**(code **)(local_10 + 0x48))
                              (local_10,3,"Attempt to add duplicate channel \'%s\' to channel list",
                               local_20);
            return eVar3;
          }
          local_68 = local_74 + 1;
        }
        local_4 = exr_attr_string_create_with_length
                            ((exr_context_t)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                             (int32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        if (local_4 == 0) {
          local_80 = *local_18;
          iVar2 = local_80 + 1;
          local_40 = local_28;
          uStack_3c = CONCAT31(uStack_3c._1_3_,(undefined1)local_2c);
          local_38 = in_stack_00000008;
          iStack_34 = in_stack_00000010;
          if (local_18[1] < iVar2) {
            local_7c = local_18[1] << 1;
            if (local_7c < iVar2) {
              local_7c = local_80 + 2;
            }
            local_58 = (**(code **)(local_10 + 0x58))((long)local_7c << 5);
            if (local_58 == 0) {
              exr_attr_string_destroy(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
              eVar3 = (**(code **)(local_10 + 0x38))(local_10,1);
              return eVar3;
            }
            local_18[1] = local_7c;
          }
          else {
            local_58 = *(long *)(local_18 + 2);
          }
          for (; local_68 < local_80; local_80 = local_80 + -1) {
            puVar4 = (undefined8 *)(local_58 + (long)local_80 * 0x20);
            puVar5 = (undefined8 *)(lVar1 + (long)(local_80 + -1) * 0x20);
            *puVar4 = *puVar5;
            puVar4[1] = puVar5[1];
            puVar4[2] = puVar5[2];
            puVar4[3] = puVar5[3];
          }
          puVar4 = (undefined8 *)(local_58 + (long)local_68 * 0x20);
          *puVar4 = local_50;
          puVar4[1] = local_48;
          puVar4[2] = CONCAT44(uStack_3c,local_40);
          puVar4[3] = CONCAT44(iStack_34,local_38);
          if ((lVar1 != 0) && (local_58 != lVar1)) {
            for (iVar6 = 0; iVar6 < local_68; iVar6 = iVar6 + 1) {
              puVar4 = (undefined8 *)(local_58 + (long)iVar6 * 0x20);
              puVar5 = (undefined8 *)(lVar1 + (long)iVar6 * 0x20);
              *puVar4 = *puVar5;
              puVar4[1] = puVar5[1];
              puVar4[2] = puVar5[2];
              puVar4[3] = puVar5[3];
            }
            (**(code **)(local_10 + 0x60))(lVar1);
          }
          *local_18 = iVar2;
          *(long *)(local_18 + 2) = local_58;
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = (**(code **)(local_10 + 0x48))
                          (local_10,3,
                           "Invalid perceptual linear flag value (%d) adding channel \'%s\' to list"
                           ,local_2c,local_20);
    }
  }
  else {
    local_4 = (**(code **)(local_10 + 0x48))
                        (local_10,3,
                         "Invalid pixel type specified (%d) adding channel \'%s\' to list",local_28,
                         local_20);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_chlist_add_with_length (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    int32_t                    namelen,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    exr_attr_chlist_entry_t  nent = {{0}};
    exr_attr_chlist_entry_t *nlist, *olist;
    int                      newcount, insertpos;
    int32_t                  maxlen;
    exr_result_t             rv;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    maxlen = ctxt->max_name_length;

    if (!clist)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid channel list pointer to chlist_add_with_length");

    if (!name || name[0] == '\0' || namelen == 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Channel name must not be empty, received '%s'",
            (name ? name : "<NULL>"));

    if (namelen > maxlen)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Channel name must shorter than length allowed by file (%d), received '%s' (%d)",
            maxlen,
            name,
            namelen);

    if (ptype != EXR_PIXEL_UINT && ptype != EXR_PIXEL_HALF &&
        ptype != EXR_PIXEL_FLOAT)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel type specified (%d) adding channel '%s' to list",
            (int) ptype,
            name);

    if (islinear != EXR_PERCEPTUALLY_LOGARITHMIC &&
        islinear != EXR_PERCEPTUALLY_LINEAR)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid perceptual linear flag value (%d) adding channel '%s' to list",
            (int) islinear,
            name);

    if (xsamp <= 0 || ysamp <= 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid pixel sampling (x %d y %d) adding channel '%s' to list",
            xsamp,
            ysamp,
            name);

    insertpos = 0;
    olist     = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);
    for (int32_t c = 0; c < clist->num_channels; ++c)
    {
        int ord = strcmp (name, olist[c].name.str);
        if (ord < 0)
        {
            insertpos = c;
            break;
        }
        else if (ord == 0)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Attempt to add duplicate channel '%s' to channel list",
                name);
        }
        else
            insertpos = c + 1;
    }

    /* temporarily use newcount as a return value check */
    rv = exr_attr_string_create_with_length (ctxt, &(nent.name), name, namelen);
    if (rv != EXR_ERR_SUCCESS) return rv;

    newcount        = clist->num_channels + 1;
    nent.pixel_type = ptype;
    nent.p_linear   = (uint8_t) islinear;
    nent.x_sampling = xsamp;
    nent.y_sampling = ysamp;

    if (newcount > clist->num_alloced)
    {
        int nsz = clist->num_alloced * 2;
        if (newcount > nsz) nsz = newcount + 1;
        nlist = (exr_attr_chlist_entry_t*) ctxt->alloc_fn (
            sizeof (*nlist) * (size_t) nsz);
        if (nlist == NULL)
        {
            exr_attr_string_destroy (ctxt, &(nent.name));
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }
        clist->num_alloced = nsz;
    }
    else
        nlist = EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

    /* since we can re-use same memory, have to have slightly more
     * complex logic to avoid overwrites, find where we will insert
     * and copy entries after that first */

    /* shift old entries further first */
    for (int i = newcount - 1; i > insertpos; --i)
        nlist[i] = olist[i - 1];
    nlist[insertpos] = nent;
    if (olist && nlist != olist)
    {
        for (int i = 0; i < insertpos; ++i)
            nlist[i] = olist[i];

        ctxt->free_fn (olist);
    }

    clist->num_channels = newcount;
    clist->entries      = nlist;

    return EXR_ERR_SUCCESS;
}